

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O1

int LZ4_loadDictHC(LZ4_streamHC_t *LZ4_streamHCPtr,char *dictionary,int dictSize)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  LZ4_byte *pLVar4;
  ushort uVar5;
  uint uVar6;
  void *pvVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  LZ4_streamHC_t *LZ4_streamHCPtr_1;
  int *piVar12;
  
  iVar9 = 0x10000;
  if (dictSize < 0x10000) {
    iVar9 = dictSize;
  }
  piVar12 = (int *)(dictionary + ((ulong)(uint)dictSize - 0x10000));
  if (dictSize < 0x10001) {
    piVar12 = (int *)dictionary;
  }
  uVar1 = (LZ4_streamHCPtr->internal_donotuse).compressionLevel;
  if (((ulong)LZ4_streamHCPtr & 7) == 0 && LZ4_streamHCPtr != (LZ4_streamHC_t *)0x0) {
    memset(LZ4_streamHCPtr,0,0x40030);
    (LZ4_streamHCPtr->internal_donotuse).compressionLevel = 9;
  }
  uVar2 = 0xc;
  if (uVar1 < 0xc) {
    uVar2 = uVar1;
  }
  uVar5 = 9;
  if (0 < (short)uVar1) {
    uVar5 = uVar2;
  }
  (LZ4_streamHCPtr->internal_donotuse).compressionLevel = uVar5;
  uVar11 = (long)(LZ4_streamHCPtr->internal_donotuse).end - (long)LZ4_streamHCPtr->table[0x8001];
  if (0x40000000 < uVar11) {
    uVar11 = 0;
    memset(LZ4_streamHCPtr,0,0x20000);
    memset(LZ4_streamHCPtr->table + 0x4000,0xff,0x20000);
  }
  uVar6 = (int)uVar11 + 0x10000;
  (LZ4_streamHCPtr->internal_donotuse).nextToUpdate = uVar6;
  pvVar7 = (void *)((long)piVar12 + (-0x10000 - uVar11));
  LZ4_streamHCPtr->table[0x8001] = pvVar7;
  LZ4_streamHCPtr->table[0x8002] = pvVar7;
  (LZ4_streamHCPtr->internal_donotuse).dictLimit = uVar6;
  (LZ4_streamHCPtr->internal_donotuse).lowLimit = uVar6;
  (LZ4_streamHCPtr->internal_donotuse).end = (LZ4_byte *)((long)iVar9 + (long)piVar12);
  if (3 < dictSize) {
    pLVar4 = (LZ4_byte *)((long)iVar9 + (long)piVar12) + (-3 - (long)pvVar7);
    uVar3 = (uint)pLVar4;
    if (uVar6 < uVar3) {
      uVar11 = uVar11 + 0x10000;
      do {
        uVar8 = (ulong)((uint)(*piVar12 * -0x61c8864f) >> 0x11);
        uVar10 = (uint)uVar11;
        uVar6 = uVar10 - *(int *)((long)LZ4_streamHCPtr + uVar8 * 4);
        if (0xfffe < uVar6) {
          uVar6 = 0xffff;
        }
        *(short *)((long)LZ4_streamHCPtr + (ulong)(uVar10 & 0xffff) * 2 + 0x20000) = (short)uVar6;
        *(uint *)((long)LZ4_streamHCPtr + uVar8 * 4) = uVar10;
        uVar11 = uVar11 + 1;
        piVar12 = (int *)((long)piVar12 + 1);
      } while (((ulong)pLVar4 & 0xffffffff) != uVar11);
    }
    (LZ4_streamHCPtr->internal_donotuse).nextToUpdate = uVar3;
  }
  return iVar9;
}

Assistant:

int LZ4_loadDictHC (LZ4_streamHC_t* LZ4_streamHCPtr,
              const char* dictionary, int dictSize)
{
    LZ4HC_CCtx_internal* const ctxPtr = &LZ4_streamHCPtr->internal_donotuse;
    DEBUGLOG(4, "LZ4_loadDictHC(ctx:%p, dict:%p, dictSize:%d)", LZ4_streamHCPtr, dictionary, dictSize);
    assert(LZ4_streamHCPtr != NULL);
    if (dictSize > 64 KB) {
        dictionary += (size_t)dictSize - 64 KB;
        dictSize = 64 KB;
    }
    /* need a full initialization, there are bad side-effects when using resetFast() */
    {   int const cLevel = ctxPtr->compressionLevel;
        LZ4_initStreamHC(LZ4_streamHCPtr, sizeof(*LZ4_streamHCPtr));
        LZ4_setCompressionLevel(LZ4_streamHCPtr, cLevel);
    }
    LZ4HC_init_internal (ctxPtr, (const BYTE*)dictionary);
    ctxPtr->end = (const BYTE*)dictionary + dictSize;
    if (dictSize >= 4) LZ4HC_Insert (ctxPtr, ctxPtr->end-3);
    return dictSize;
}